

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPM2B_CREATION_DATA_Unmarshal(TPM2B_CREATION_DATA *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    target->size = UVar2;
    *buffer = *buffer + 2;
    if (UVar2 == 0) {
      TVar3 = 0x95;
    }
    else {
      iVar1 = *size;
      TVar3 = TPMS_CREATION_DATA_Unmarshal(&target->creationData,buffer,size);
      if (TVar3 == 0) {
        TVar3 = 0x95;
        if (iVar1 - *size == (uint)target->size) {
          TVar3 = 0;
        }
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2B_CREATION_DATA_Unmarshal(TPM2B_CREATION_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size is zero, then the required structure is missing
    if(target->size == 0)
        return TPM_RC_SIZE;
    startSize = *size;
    result = TPMS_CREATION_DATA_Unmarshal((TPMS_CREATION_DATA *)&(target->creationData), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}